

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomPoints *points
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  string *psVar3;
  bool bVar4;
  uint uVar5;
  undefined7 extraout_var;
  ostream *poVar6;
  long *plVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  Property *pPVar11;
  int iVar12;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined4 in_stack_fffffffffffffc9c;
  string local_358;
  long *local_338 [2];
  long local_328 [2];
  undefined1 local_318 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_300;
  string *local_2f0;
  _Base_ptr local_2e8;
  undefined8 local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2a8;
  string *local_2a0;
  string *local_298;
  string *local_290;
  string *local_288;
  string *local_280;
  string *local_278;
  _Base_ptr local_270;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d8._M_impl.super__Rb_tree_header._M_header;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0 = 0;
  local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar5 = (uint)options->strict_allowedToken_check;
  local_2f0 = err;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2d8,properties,&points->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar4) {
    p_Var10 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_270 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_2e0 = CONCAT71(extraout_var,p_Var10 == local_270);
    if (p_Var10 != local_270) {
      local_278 = (string *)&points->points;
      local_280 = (string *)&points->normals;
      local_288 = (string *)&points->widths;
      local_290 = (string *)&points->ids;
      local_298 = (string *)&points->velocities;
      local_2a0 = (string *)&points->accelerations;
      local_2a8 = &(points->super_GPrim).props;
      do {
        local_1c8[0] = local_1b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"points","");
        pPVar11 = (Property *)local_1a8;
        local_2e8 = p_Var10 + 2;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  ((ParseResult *)local_318,(_anonymous_namespace_ *)&local_2d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8,(string *)(p_Var10 + 2),(Property *)local_1a8,local_278,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,uVar5));
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        iVar12 = 0;
        if ((local_318._0_8_ & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00227788:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_318._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd88);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_338[0] = local_328;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_338,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[7],std::__cxx11::string>
                      (&local_358,(fmt *)local_338,(string *)"points",(char (*) [7])(local_318 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar11)
            ;
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_358._M_dataplus._M_p,
                                local_358._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            psVar3 = local_2f0;
            if (local_338[0] != local_328) {
              operator_delete(local_338[0],local_328[0] + 1);
            }
            if (psVar3 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar7 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_338,(ulong)(psVar3->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_358.field_2._M_allocated_capacity = *psVar1;
                local_358.field_2._8_8_ = plVar7[3];
                local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
              }
              else {
                local_358.field_2._M_allocated_capacity = *psVar1;
                local_358._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_358._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p,
                                local_358.field_2._M_allocated_capacity + 1);
              }
              if (local_338[0] != local_328) {
                operator_delete(local_338[0],local_328[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar12 = 1;
            goto LAB_00227788;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._8_8_ != &aStack_300) {
          operator_delete((void *)local_318._8_8_,aStack_300._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_1e8[0] = local_1d8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"normals","");
          pPVar11 = (Property *)local_1a8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                    ((ParseResult *)local_318,(_anonymous_namespace_ *)&local_2d8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1e8,(string *)local_2e8,(Property *)local_1a8,local_280,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc9c,uVar5));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
          iVar12 = 0;
          if ((local_318._0_8_ & 0xfffffffd) == 0) {
            iVar12 = 3;
LAB_00227a88:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_318._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd89);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_338[0] = local_328;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[8],std::__cxx11::string>
                        (&local_358,(fmt *)local_338,(string *)"normals",
                         (char (*) [8])(local_318 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar11);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_358._M_dataplus._M_p,
                                  local_358._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p,
                                local_358.field_2._M_allocated_capacity + 1);
              }
              psVar3 = local_2f0;
              if (local_338[0] != local_328) {
                operator_delete(local_338[0],local_328[0] + 1);
              }
              if (psVar3 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_338,(ulong)(psVar3->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_358.field_2._M_allocated_capacity = *psVar1;
                  local_358.field_2._8_8_ = plVar7[3];
                  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                }
                else {
                  local_358.field_2._M_allocated_capacity = *psVar1;
                  local_358._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_358._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_358);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity + 1);
                }
                if (local_338[0] != local_328) {
                  operator_delete(local_338[0],local_328[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar12 = 1;
              goto LAB_00227a88;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._8_8_ != &aStack_300) {
            operator_delete((void *)local_318._8_8_,aStack_300._M_allocated_capacity + 1);
          }
          if (bVar4) {
            local_208[0] = local_1f8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_208,*(long *)(p_Var10 + 1),
                       (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
            local_1a8._0_8_ = local_1a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"widths","");
            pPVar11 = (Property *)local_1a8;
            (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                      ((ParseResult *)local_318,(_anonymous_namespace_ *)&local_2d8,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_208,(string *)local_2e8,(Property *)local_1a8,local_288,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc9c,uVar5));
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            iVar12 = 0;
            if ((local_318._0_8_ & 0xfffffffd) == 0) {
              iVar12 = 3;
LAB_00227d88:
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if (local_318._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                local_338[0] = local_328;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[7],std::__cxx11::string>
                          (&local_358,(fmt *)local_338,(string *)"widths",
                           (char (*) [7])(local_318 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar11);
                poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_358._M_dataplus._M_p,
                                    local_358._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity + 1);
                }
                psVar3 = local_2f0;
                if (local_338[0] != local_328) {
                  operator_delete(local_338[0],local_328[0] + 1);
                }
                if (psVar3 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar7 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)local_338,(ulong)(psVar3->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_358.field_2._M_allocated_capacity = *psVar1;
                    local_358.field_2._8_8_ = plVar7[3];
                    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                  }
                  else {
                    local_358.field_2._M_allocated_capacity = *psVar1;
                    local_358._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_358._M_string_length = plVar7[1];
                  *plVar7 = (long)psVar1;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_358);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p,
                                    local_358.field_2._M_allocated_capacity + 1);
                  }
                  if (local_338[0] != local_328) {
                    operator_delete(local_338[0],local_328[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                iVar12 = 1;
                goto LAB_00227d88;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._8_8_ != &aStack_300) {
              operator_delete((void *)local_318._8_8_,aStack_300._M_allocated_capacity + 1);
            }
            if (bVar4) {
              local_228[0] = local_218;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_228,*(long *)(p_Var10 + 1),
                         (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
              local_1a8._0_8_ = local_1a8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ids","");
              pPVar11 = (Property *)local_1a8;
              (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                        ((ParseResult *)local_318,(_anonymous_namespace_ *)&local_2d8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_228,(string *)local_2e8,(Property *)local_1a8,local_290,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc9c,uVar5));
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              if (local_228[0] != local_218) {
                operator_delete(local_228[0],local_218[0] + 1);
              }
              iVar12 = 0;
              if ((local_318._0_8_ & 0xfffffffd) == 0) {
                iVar12 = 3;
LAB_00228088:
                bVar4 = false;
              }
              else {
                bVar4 = true;
                if (local_318._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8b);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                  local_338[0] = local_328;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_338,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[4],std::__cxx11::string>
                            (&local_358,(fmt *)local_338,(string *)"ids",
                             (char (*) [4])(local_318 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar11);
                  poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_358._M_dataplus._M_p,
                                      local_358._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p,
                                    local_358.field_2._M_allocated_capacity + 1);
                  }
                  psVar3 = local_2f0;
                  if (local_338[0] != local_328) {
                    operator_delete(local_338[0],local_328[0] + 1);
                  }
                  if (psVar3 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar7 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)local_338,(ulong)(psVar3->_M_dataplus)._M_p)
                    ;
                    psVar1 = (size_type *)(plVar7 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar7 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_358.field_2._M_allocated_capacity = *psVar1;
                      local_358.field_2._8_8_ = plVar7[3];
                      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                    }
                    else {
                      local_358.field_2._M_allocated_capacity = *psVar1;
                      local_358._M_dataplus._M_p = (pointer)*plVar7;
                    }
                    local_358._M_string_length = plVar7[1];
                    *plVar7 = (long)psVar1;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_358);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_358._M_dataplus._M_p != &local_358.field_2) {
                      operator_delete(local_358._M_dataplus._M_p,
                                      local_358.field_2._M_allocated_capacity + 1);
                    }
                    if (local_338[0] != local_328) {
                      operator_delete(local_338[0],local_328[0] + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  iVar12 = 1;
                  goto LAB_00228088;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._8_8_ != &aStack_300) {
                operator_delete((void *)local_318._8_8_,aStack_300._M_allocated_capacity + 1);
              }
              if (bVar4) {
                local_248[0] = local_238;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_248,*(long *)(p_Var10 + 1),
                           (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
                local_1a8._0_8_ = local_1a8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"velocities","");
                pPVar11 = (Property *)local_1a8;
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                          ((ParseResult *)local_318,(_anonymous_namespace_ *)&local_2d8,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_248,(string *)local_2e8,(Property *)local_1a8,local_298,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffc9c,uVar5));
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                if (local_248[0] != local_238) {
                  operator_delete(local_248[0],local_238[0] + 1);
                }
                iVar12 = 0;
                if ((local_318._0_8_ & 0xfffffffd) == 0) {
                  iVar12 = 3;
LAB_00228388:
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                  if (local_318._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8c);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    local_338[0] = local_328;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[11],std::__cxx11::string>
                              (&local_358,(fmt *)local_338,(string *)"velocities",
                               (char (*) [11])(local_318 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar11);
                    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1a8,local_358._M_dataplus._M_p,
                                        local_358._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_358._M_dataplus._M_p != &local_358.field_2) {
                      operator_delete(local_358._M_dataplus._M_p,
                                      local_358.field_2._M_allocated_capacity + 1);
                    }
                    psVar3 = local_2f0;
                    if (local_338[0] != local_328) {
                      operator_delete(local_338[0],local_328[0] + 1);
                    }
                    if (psVar3 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar7 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)local_338,
                                                  (ulong)(psVar3->_M_dataplus)._M_p);
                      psVar1 = (size_type *)(plVar7 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar7 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_358.field_2._M_allocated_capacity = *psVar1;
                        local_358.field_2._8_8_ = plVar7[3];
                        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                      }
                      else {
                        local_358.field_2._M_allocated_capacity = *psVar1;
                        local_358._M_dataplus._M_p = (pointer)*plVar7;
                      }
                      local_358._M_string_length = plVar7[1];
                      *plVar7 = (long)psVar1;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_358);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p != &local_358.field_2) {
                        operator_delete(local_358._M_dataplus._M_p,
                                        local_358.field_2._M_allocated_capacity + 1);
                      }
                      if (local_338[0] != local_328) {
                        operator_delete(local_338[0],local_328[0] + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                    iVar12 = 1;
                    goto LAB_00228388;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._8_8_ != &aStack_300) {
                  operator_delete((void *)local_318._8_8_,aStack_300._M_allocated_capacity + 1);
                }
                if (bVar4) {
                  local_268[0] = local_258;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_268,*(long *)(p_Var10 + 1),
                             (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
                  local_1a8._0_8_ = local_1a8 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"accelerations","");
                  pPVar11 = (Property *)local_1a8;
                  (anonymous_namespace)::
                  ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                            ((ParseResult *)local_318,(_anonymous_namespace_ *)&local_2d8,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_268,(string *)local_2e8,(Property *)local_1a8,local_2a0,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffc9c,uVar5));
                  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                  }
                  if (local_268[0] != local_258) {
                    operator_delete(local_268[0],local_258[0] + 1);
                  }
                  iVar12 = 0;
                  if ((local_318._0_8_ & 0xfffffffd) == 0) {
                    iVar12 = 3;
LAB_00228688:
                    bVar4 = false;
                  }
                  else {
                    bVar4 = true;
                    if (local_318._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"():",3);
                      poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8d);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      local_338[0] = local_328;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_338,"Parsing attribute `{}` failed. Error: {}","");
                      fmt::format<char[14],std::__cxx11::string>
                                (&local_358,(fmt *)local_338,(string *)"accelerations",
                                 (char (*) [14])(local_318 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar11);
                      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_1a8,local_358._M_dataplus._M_p,
                                          local_358._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p != &local_358.field_2) {
                        operator_delete(local_358._M_dataplus._M_p,
                                        local_358.field_2._M_allocated_capacity + 1);
                      }
                      psVar3 = local_2f0;
                      if (local_338[0] != local_328) {
                        operator_delete(local_338[0],local_328[0] + 1);
                      }
                      if (psVar3 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar7 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)local_338,
                                                    (ulong)(psVar3->_M_dataplus)._M_p);
                        psVar1 = (size_type *)(plVar7 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar7 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar1) {
                          local_358.field_2._M_allocated_capacity = *psVar1;
                          local_358.field_2._8_8_ = plVar7[3];
                          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                        }
                        else {
                          local_358.field_2._M_allocated_capacity = *psVar1;
                          local_358._M_dataplus._M_p = (pointer)*plVar7;
                        }
                        local_358._M_string_length = plVar7[1];
                        *plVar7 = (long)psVar1;
                        plVar7[1] = 0;
                        *(undefined1 *)(plVar7 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)psVar3,(string *)&local_358);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_358._M_dataplus._M_p != &local_358.field_2) {
                          operator_delete(local_358._M_dataplus._M_p,
                                          local_358.field_2._M_allocated_capacity + 1);
                        }
                        if (local_338[0] != local_328) {
                          operator_delete(local_338[0],local_328[0] + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                      ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                      iVar12 = 1;
                      goto LAB_00228688;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._8_8_ != &aStack_300) {
                    operator_delete((void *)local_318._8_8_,aStack_300._M_allocated_capacity + 1);
                  }
                  if (bVar4) {
                    __k = p_Var10 + 1;
                    cVar8 = ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&local_2d8,(key_type *)__k);
                    if ((_Rb_tree_header *)cVar8._M_node == &local_2d8._M_impl.super__Rb_tree_header
                       ) {
                      pmVar9 = ::std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               ::operator[](local_2a8,(key_type *)__k);
                      ::std::__cxx11::string::_M_assign((string *)pmVar9);
                      (pmVar9->_attrib)._varying_authored = (bool)p_Var10[3].field_0x4;
                      (pmVar9->_attrib)._variability = p_Var10[3]._M_color;
                      ::std::__cxx11::string::_M_assign((string *)&(pmVar9->_attrib)._type_name);
                      linb::any::operator=
                                ((any *)&(pmVar9->_attrib)._var,(any *)&p_Var10[4]._M_parent);
                      (pmVar9->_attrib)._var._blocked = SUB41(p_Var10[5]._M_color,0);
                      ::std::
                      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ::operator=(&(pmVar9->_attrib)._var._ts._samples,
                                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                   *)&p_Var10[5]._M_parent);
                      (pmVar9->_attrib)._var._ts._dirty = SUB41(p_Var10[6]._M_color,0);
                      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                (&(pmVar9->_attrib)._paths,
                                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 &p_Var10[6]._M_parent);
                      AttrMetas::operator=(&(pmVar9->_attrib)._metas,(AttrMetas *)(p_Var10 + 7));
                      *(_Base_ptr *)&pmVar9->_listOpQual = p_Var10[0x17]._M_parent;
                      (pmVar9->_rel).type = *(Type *)&p_Var10[0x17]._M_left;
                      Path::operator=(&(pmVar9->_rel).targetPath,(Path *)&p_Var10[0x17]._M_right);
                      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                (&(pmVar9->_rel).targetPathVector,
                                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 &p_Var10[0x1e]._M_parent);
                      (pmVar9->_rel).listOpQual = p_Var10[0x1f]._M_color;
                      AttrMetas::operator=
                                (&(pmVar9->_rel)._metas,(AttrMetas *)&p_Var10[0x1f]._M_parent);
                      (pmVar9->_rel)._varying_authored = *(bool *)&p_Var10[0x2f]._M_left;
                      ::std::__cxx11::string::_M_assign((string *)&pmVar9->_prop_value_type_name);
                      pmVar9->_has_custom = *(bool *)&p_Var10[0x30]._M_right;
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&local_2d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                    }
                    cVar8 = ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&local_2d8,(key_type *)__k);
                    iVar12 = 0;
                    if ((_Rb_tree_header *)cVar8._M_node == &local_2d8._M_impl.super__Rb_tree_header
                       ) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"():",3);
                      poVar6 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8f);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_318,"Unsupported/unimplemented property: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__k);
                      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_1a8,(char *)local_318._0_8_,
                                          local_318._8_8_);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      psVar1 = (size_type *)(local_318 + 0x10);
                      if ((size_type *)local_318._0_8_ != psVar1) {
                        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
                      }
                      psVar3 = local_2f0;
                      if (local_2f0 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar7 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)&local_358,
                                                    (ulong)(psVar3->_M_dataplus)._M_p);
                        psVar2 = (size_type *)(plVar7 + 2);
                        if ((size_type *)*plVar7 == psVar2) {
                          local_318._16_8_ = *psVar2;
                          aStack_300._M_allocated_capacity = plVar7[3];
                          local_318._0_8_ = psVar1;
                        }
                        else {
                          local_318._16_8_ = *psVar2;
                          local_318._0_8_ = (size_type *)*plVar7;
                        }
                        local_318._8_8_ = plVar7[1];
                        *plVar7 = (long)psVar2;
                        plVar7[1] = 0;
                        *(undefined1 *)(plVar7 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)psVar3,(string *)local_318);
                        if ((size_type *)local_318._0_8_ != psVar1) {
                          operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_358._M_dataplus._M_p != &local_358.field_2) {
                          operator_delete(local_358._M_dataplus._M_p,
                                          local_358.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                      ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                      iVar12 = 1;
                    }
                  }
                }
              }
            }
          }
        }
        if ((iVar12 != 3) && (iVar12 != 0)) break;
        p_Var10 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
        local_2e0 = CONCAT71((int7)((ulong)p_Var10 >> 8),p_Var10 == local_270);
      } while (p_Var10 != local_270);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2d8,(_Link_type)local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)local_2e0 & 1);
}

Assistant:

bool ReconstructPrim<GeomPoints>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomPoints *points,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct Points.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, points, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomPoints, points->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomPoints, points->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomPoints, points->widths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", GeomPoints, points->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomPoints, points->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomPoints, points->accelerations)
    ADD_PROPERTY(table, prop, GeomSphere, points->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}